

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::ArrayPtr<void*const>&>
          (String *__return_storage_ptr__,kj *this,ArrayPtr<void_*const> *params)

{
  ArrayPtr<void_*const> *this_00;
  ArrayPtr<void_*const> *value;
  Delimited<kj::ArrayPtr<void_*const>_> *params_00;
  Delimited<kj::ArrayPtr<void_*const>_> local_50;
  kj *local_18;
  ArrayPtr<void_*const> *params_local;
  
  local_18 = this;
  params_local = (ArrayPtr<void_*const> *)__return_storage_ptr__;
  this_00 = fwd<kj::ArrayPtr<void*const>&>((ArrayPtr<void_*const> *)this);
  toCharSequence<kj::ArrayPtr<void*const>&>(&local_50,(kj *)this_00,value);
  _::concat<kj::_::Delimited<kj::ArrayPtr<void*const>>>
            (__return_storage_ptr__,(_ *)&local_50,params_00);
  _::Delimited<kj::ArrayPtr<void_*const>_>::~Delimited(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}